

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeMemSetRowSet(Mem *pMem)

{
  RowSet *pRVar1;
  long in_RDI;
  RowSet *p;
  sqlite3 *db;
  sqlite3 *db_00;
  int local_4;
  
  db_00 = (sqlite3 *)&DAT_aaaaaaaaaaaaaaaa;
  sqlite3VdbeMemRelease((Mem *)0x18bd10);
  pRVar1 = sqlite3RowSetInit(db_00);
  if (pRVar1 == (RowSet *)0x0) {
    local_4 = 7;
  }
  else {
    *(RowSet **)(in_RDI + 8) = pRVar1;
    *(undefined2 *)(in_RDI + 0x14) = 0x1010;
    *(code **)(in_RDI + 0x30) = sqlite3RowSetDelete;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemSetRowSet(Mem *pMem){
  sqlite3 *db = pMem->db;
  RowSet *p;
  assert( db!=0 );
  assert( !sqlite3VdbeMemIsRowSet(pMem) );
  sqlite3VdbeMemRelease(pMem);
  p = sqlite3RowSetInit(db);
  if( p==0 ) return SQLITE_NOMEM;
  pMem->z = (char*)p;
  pMem->flags = MEM_Blob|MEM_Dyn;
  pMem->xDel = sqlite3RowSetDelete;
  return SQLITE_OK;
}